

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMappedVector.hpp
# Opt level: O0

BlockIterator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_32,_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_**>
* __thiscall
gmlc::containers::
StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>
::find(StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>
       *this,string_view searchValue)

{
  bool bVar1;
  StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
  *in_RSI;
  BlockIterator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_32,_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_**>
  *in_RDI;
  iterator fnd;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
  *in_stack_ffffffffffffff98;
  BlockIterator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_32,_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_**>
  *this_00;
  StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
  *in_stack_ffffffffffffffc0;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
  local_28;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
  local_20 [4];
  
  this_00 = in_RDI;
  local_20[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
       ::find(in_stack_ffffffffffffff98,(key_type *)0x335af5);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
       ::end(in_stack_ffffffffffffff98);
  bVar1 = std::__detail::operator==(local_20,&local_28);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
    ::end(in_stack_ffffffffffffffc0);
  }
  else {
    StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
    ::begin(in_RSI);
    std::__detail::
    _Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_false,_true>
    ::operator->((_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_false,_true>
                  *)0x335b3d);
    BlockIterator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_32,_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_**>
    ::operator+(this_00,(ptrdiff_t *)in_stack_ffffffffffffff98);
  }
  return in_RDI;
}

Assistant:

auto find(std::string_view searchValue)
        {
            auto fnd = lookup.find(searchValue);
            if (fnd != lookup.end()) {
                return dataStorage.begin() + fnd->second;
            }
            return dataStorage.end();
        }